

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void __thiscall testing::internal::ExpectationBase::~ExpectationBase(ExpectationBase *this)

{
  this->_vptr_ExpectationBase = (_func_int **)&PTR__ExpectationBase_00167428;
  Mutex::~Mutex(&this->mutex_);
  std::_Vector_base<const_void_*,_std::allocator<const_void_*>_>::~_Vector_base
            (&(this->untyped_actions_).
              super__Vector_base<const_void_*,_std::allocator<const_void_*>_>);
  std::
  _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
               *)&this->immediate_prerequisites_);
  linked_ptr<const_testing::CardinalityInterface>::~linked_ptr(&(this->cardinality_).impl_);
  std::__cxx11::string::~string((string *)&this->source_text_);
  return;
}

Assistant:

ExpectationBase::~ExpectationBase() {}